

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInNestedExtensions
          (Generator *this,Descriptor *descriptor)

{
  int iVar1;
  Descriptor *descriptor_00;
  FieldDescriptor *extension_field;
  undefined4 local_20;
  undefined4 local_1c;
  int i_1;
  int i;
  Descriptor *descriptor_local;
  Generator *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Descriptor::nested_type_count(descriptor);
    if (iVar1 <= local_1c) break;
    descriptor_00 = Descriptor::nested_type(descriptor,local_1c);
    FixForeignFieldsInNestedExtensions(this,descriptor_00);
    local_1c = local_1c + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar1 = Descriptor::extension_count(descriptor);
    if (iVar1 <= local_20) break;
    extension_field = Descriptor::extension(descriptor,local_20);
    FixForeignFieldsInExtension(this,extension_field);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void Generator::FixForeignFieldsInNestedExtensions(
    const Descriptor& descriptor) const {
  // Recursively fix up extensions in all nested types.
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixForeignFieldsInNestedExtensions(*descriptor.nested_type(i));
  }
  // Fix up extensions directly contained within this type.
  for (int i = 0; i < descriptor.extension_count(); ++i) {
    FixForeignFieldsInExtension(*descriptor.extension(i));
  }
}